

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O1

void inlet_bang(_inlet *x)

{
  t_pd *pp_Var1;
  t_symbol *ptVar2;
  t_gotfn p_Var3;
  
  ptVar2 = x->i_symfrom;
  if (ptVar2 == &s_bang) {
    pd_vmess(x->i_dest,(x->i_un).iu_symto,"");
    return;
  }
  if (ptVar2 != (t_symbol *)0x0) {
    if (ptVar2 == &s_list) {
      inlet_list(x,&s_bang,0,(t_atom *)0x0);
      return;
    }
    if (ptVar2 == &s_signal) {
      pp_Var1 = x->i_dest;
      ptVar2 = gensym("fwd");
      p_Var3 = zgetfn(pp_Var1,ptVar2);
      if (p_Var3 != (t_gotfn)0x0) {
        pp_Var1 = x->i_dest;
        ptVar2 = gensym("fwd");
        pd_vmess(pp_Var1,ptVar2,"s",&s_bang);
        return;
      }
    }
    pd_error(x->i_owner,"inlet: expected \'%s\' but got \'%s\'",x->i_symfrom->s_name,s_bang.s_name);
    return;
  }
  pd_bang(x->i_dest);
  return;
}

Assistant:

static void inlet_bang(t_inlet *x)
{
    if (x->i_symfrom == &s_bang)
        pd_vmess(x->i_dest, x->i_symto, "");
    else if (!x->i_symfrom) pd_bang(x->i_dest);
    else if (x->i_symfrom == &s_list)
        inlet_list(x, &s_bang, 0, 0);
    else if (x->i_symfrom == &s_signal && zgetfn(x->i_dest, gensym("fwd")))
        vmess(x->i_dest, gensym("fwd"), "s", &s_bang);
    else inlet_wrong(x, &s_bang);
}